

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatetimeParser.cpp
# Opt level: O2

bool __thiscall DatetimeParser::parse_hour(DatetimeParser *this,Pig *pig,int *value)

{
  bool bVar1;
  size_type previous;
  int hour;
  uint local_2c;
  
  previous = Pig::cursor(pig);
  bVar1 = Pig::getDigit2(pig,(int *)&local_2c);
  if (local_2c < 0x18 && bVar1) {
    *value = local_2c;
  }
  else {
    Pig::restoreTo(pig,previous);
  }
  return local_2c < 0x18 && bVar1;
}

Assistant:

bool DatetimeParser::parse_hour (Pig& pig, int& value)
{
  auto checkpoint = pig.cursor ();

  int hour;
  if (pig.getDigit2 (hour) &&
      hour >= 0            &&
      hour < 24)
  {
    value = hour;
    return true;
  }

  pig.restoreTo (checkpoint);
  return false;
}